

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O1

CBlockIndex * __thiscall CChain::Next(CChain *this,CBlockIndex *pindex)

{
  int iVar1;
  pointer ppCVar2;
  CBlockIndex *pCVar3;
  long in_FS_OFFSET;
  
  iVar1 = pindex->nHeight;
  if (((long)iVar1 < 0) ||
     (ppCVar2 = (this->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->vChain).
                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)ppCVar2) >> 3) <= iVar1)) {
    pCVar3 = (CBlockIndex *)0x0;
  }
  else {
    pCVar3 = ppCVar2[iVar1];
  }
  if ((pCVar3 == pindex) && (-2 < iVar1)) {
    ppCVar2 = (this->vChain).super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((int)(iVar1 + 1U) <
        (int)((ulong)((long)(this->vChain).
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2) >> 3)) {
      pCVar3 = ppCVar2[iVar1 + 1U];
      goto LAB_001f4721;
    }
  }
  pCVar3 = (CBlockIndex *)0x0;
LAB_001f4721:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return pCVar3;
  }
  __stack_chk_fail();
}

Assistant:

CBlockIndex* Next(const CBlockIndex* pindex) const
    {
        if (Contains(pindex))
            return (*this)[pindex->nHeight + 1];
        else
            return nullptr;
    }